

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O0

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>::
_adjRemoveRefs(HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
               *this,size_t level,
              Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
              *pNode)

{
  bool bVar1;
  SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *pSVar2;
  SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *pSVar3;
  NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *pNVar4;
  size_t sVar5;
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_> *in_RDX
  ;
  SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *in_RSI;
  long in_RDI;
  SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *thatRefs;
  size_t in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar6;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar7;
  SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *local_10;
  
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>::
  nodeRefs(in_RDX);
  local_10 = in_RSI;
  do {
    pSVar3 = local_10;
    pSVar2 = (SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
              *)SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                ::height((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                          *)0xa395b4);
    uVar7 = false;
    if (pSVar3 < pSVar2) {
      uVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
              ::canSwap((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                         *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    }
    if ((bool)uVar7 == false) break;
    pNVar4 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
             ::operator[]((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                           *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
    sVar5 = pNVar4->width;
    pNVar4 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
             ::operator[]((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                           *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
    pNVar4->width = (sVar5 - 1) + pNVar4->width;
    SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
    ::swap((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
            *)CONCAT17(uVar7,in_stack_ffffffffffffffd0),pSVar3);
    local_10 = (SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                *)((long)&(local_10->_nodes).
                          super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
    bVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
            ::canSwap((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                       *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  } while (bVar1);
  for (; pSVar3 = (SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                   *)SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                     ::height((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                               *)0xa3966b), local_10 < pSVar3;
      local_10 = (SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                  *)((long)&(local_10->_nodes).
                            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1)) {
    pNVar4 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
             ::operator[]((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                           *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
    pNVar4->width = pNVar4->width - 1;
  }
  while( true ) {
    sVar5 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
            ::height((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                      *)0xa396b5);
    bVar6 = 0;
    if (sVar5 != 0) {
      sVar5 = in_RDI + 0x10;
      SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
      ::height((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                *)0xa396dd);
      pNVar4 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
               ::operator[]((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                             *)CONCAT17(bVar6,in_stack_ffffffffffffffb0),sVar5);
      bVar6 = pNVar4->pNode !=
              (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
               *)0x0 ^ 0xff;
    }
    if ((bVar6 & 1) == 0) break;
    SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
    ::pop_back((SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                *)0xa39712);
  }
  return;
}

Assistant:

void HeadNode<T, _Compare>::_adjRemoveRefs(size_t level,
                                           Node<T, _Compare> *pNode) {
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->nodeRefs();

    // Swap all remaining levels
    // This assertion checks that if swapping can take place we must be at the
    // same level.
    assert(! thatRefs.canSwap() || level == thatRefs.swapLevel());
    while (level < _nodeRefs.height() && thatRefs.canSwap()) {
        assert(level == thatRefs.swapLevel());
        // Compute the new width for the new node
        thatRefs[level].width += _nodeRefs[level].width - 1;
        thatRefs.swap(_nodeRefs);
        ++level;
        if (! thatRefs.canSwap()) {
            break;
        }
    }
    assert(! thatRefs.canSwap());
    // Decrement my widths as my references are now going over the top of
    // pNode.
    while (level < _nodeRefs.height()) {
        _nodeRefs[level++].width -= 1;
    }
    // Decrement my stack while top has a NULL pointer.
    while (_nodeRefs.height() && ! _nodeRefs[_nodeRefs.height() - 1].pNode) {
        _nodeRefs.pop_back();
    }
}